

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

vector<json11::Json,_std::allocator<json11::Json>_> *
json11::Json::parse_multi
          (vector<json11::Json,_std::allocator<json11::Json>_> *__return_storage_ptr__,string *in,
          size_type *parser_stop_pos,string *err,JsonParse strategy)

{
  JsonParser parser;
  undefined1 local_60 [24];
  size_type local_48;
  string *local_40;
  byte local_38;
  JsonParse local_34;
  
  local_48 = 0;
  local_38 = 0;
  *parser_stop_pos = 0;
  (__return_storage_ptr__->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._16_8_ = in;
  local_40 = err;
  local_34 = strategy;
  while( true ) {
    if ((local_48 == in->_M_string_length) || ((local_38 & 1) != 0)) {
      return __return_storage_ptr__;
    }
    anon_unknown_21::JsonParser::parse_json
              ((JsonParser *)local_60,(int)(JsonParser *)(local_60 + 0x10));
    std::vector<json11::Json,_std::allocator<json11::Json>_>::emplace_back<json11::Json>
              (__return_storage_ptr__,(Json *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
    anon_unknown_21::JsonParser::consume_garbage((JsonParser *)(local_60 + 0x10));
    if (local_38 != 0) break;
    *parser_stop_pos = local_48;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Json> Json::parse_multi(const string &in,
                               std::string::size_type &parser_stop_pos,
                               string &err,
                               JsonParse strategy) {
    JsonParser parser { in, 0, err, false, strategy };
    parser_stop_pos = 0;
    vector<Json> json_vec;
    while (parser.i != in.size() && !parser.failed) {
        json_vec.push_back(parser.parse_json(0));
        if (parser.failed)
            break;

        // Check for another object
        parser.consume_garbage();
        if (parser.failed)
            break;
        parser_stop_pos = parser.i;
    }
    return json_vec;
}